

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::Build
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this)

{
  bool bVar1;
  idx_t run_idx;
  idx_t level_idx;
  
  while ((this->build_level).super___atomic_base<unsigned_long>._M_i <
         (ulong)(((long)(this->tree).
                        super_vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                        .
                        super__Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->tree).
                       super_vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                       .
                       super__Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
    bVar1 = TryNextRun(this,&level_idx,&run_idx);
    if (bVar1) {
      BuildRun(this,level_idx,run_idx);
    }
    else {
      sched_yield();
    }
  }
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::Build() {
	//	Fan in parent levels until we are at the top
	//	Note that we don't build the top layer as that would just be all the data.
	while (build_level.load() < tree.size()) {
		idx_t level_idx;
		idx_t run_idx;
		if (TryNextRun(level_idx, run_idx)) {
			BuildRun(level_idx, run_idx);
		} else {
			std::this_thread::yield();
		}
	}
}